

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O3

void __thiscall
duckdb::WindowQuantileState<signed_char>::WindowList<signed_char,true>
          (WindowQuantileState<signed_char> *this,CursorType *data,SubFrames *frames,idx_t n,
          Vector *list,idx_t lidx,QuantileBindData *bind_data)

{
  long lVar1;
  size_type *psVar2;
  char cVar3;
  long lVar4;
  Vector *result;
  const_reference q_00;
  long lVar5;
  long lVar6;
  unsigned_long *q;
  size_type *psVar7;
  
  lVar1 = *(long *)(list + 0x20);
  lVar6 = lidx * 0x10;
  lVar4 = duckdb::ListVector::GetListSize(list);
  *(long *)(lVar1 + lVar6) = lVar4;
  lVar5 = ((long)(bind_data->quantiles).
                 super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>.
                 super__Vector_base<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(bind_data->quantiles).
                 super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>.
                 super__Vector_base<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
  *(long *)(lVar1 + 8 + lVar6) = lVar5;
  duckdb::ListVector::Reserve(list,lVar5 + lVar4);
  duckdb::ListVector::SetListSize(list,*(long *)(lVar1 + 8 + lVar6) + *(long *)(lVar1 + lVar6));
  result = (Vector *)duckdb::ListVector::GetEntry(list);
  psVar7 = (bind_data->order).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar2 = (bind_data->order).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar7 != psVar2) {
    lVar4 = *(long *)(result + 0x20);
    do {
      q_00 = vector<duckdb::QuantileValue,_true>::operator[](&bind_data->quantiles,*psVar7);
      cVar3 = WindowScalar<signed_char,true>(this,data,frames,n,result,q_00);
      *(char *)(*psVar7 + *(long *)(lVar1 + lVar6) + lVar4) = cVar3;
      psVar7 = psVar7 + 1;
    } while (psVar7 != psVar2);
  }
  return;
}

Assistant:

void WindowList(CursorType &data, const SubFrames &frames, const idx_t n, Vector &list, const idx_t lidx,
	                const QuantileBindData &bind_data) const {
		D_ASSERT(n > 0);
		// Result is a constant LIST<CHILD_TYPE> with a fixed length
		auto ldata = FlatVector::GetData<list_entry_t>(list);
		auto &lentry = ldata[lidx];
		lentry.offset = ListVector::GetListSize(list);
		lentry.length = bind_data.quantiles.size();

		ListVector::Reserve(list, lentry.offset + lentry.length);
		ListVector::SetListSize(list, lentry.offset + lentry.length);
		auto &result = ListVector::GetEntry(list);
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			rdata[lentry.offset + q] = WindowScalar<CHILD_TYPE, DISCRETE>(data, frames, n, result, quantile);
		}
	}